

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::ConvertToSampledImagePass::Process(ConvertToSampledImagePass *this)

{
  __node_base_ptr *this_00;
  Instruction *sampler_variable;
  bool bVar1;
  bool bVar2;
  Status SVar3;
  reference descriptor_set_binding;
  pointer ppVar4;
  _Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
  local_e8;
  _Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
  local_e0;
  iterator image_itr;
  pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*> *sampler;
  iterator __end2_1;
  iterator __begin2_1;
  DescriptorSetBindingToInstruction *__range2_1;
  pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*> *image;
  iterator __end2;
  iterator __begin2;
  DescriptorSetBindingToInstruction *__range2;
  undefined1 local_90 [8];
  DescriptorSetBindingToInstruction descriptor_set_binding_pair_to_image;
  DescriptorSetBindingToInstruction descriptor_set_binding_pair_to_sampler;
  Status status;
  ConvertToSampledImagePass *this_local;
  
  descriptor_set_binding_pair_to_sampler._M_h._M_single_bucket._4_4_ = SuccessWithoutChange;
  std::
  unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
  ::unordered_map((unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
                   *)&descriptor_set_binding_pair_to_image._M_h._M_single_bucket);
  std::
  unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
  ::unordered_map((unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
                   *)local_90);
  bVar1 = CollectResourcesToConvert
                    (this,(DescriptorSetBindingToInstruction *)
                          &descriptor_set_binding_pair_to_image._M_h._M_single_bucket,
                     (DescriptorSetBindingToInstruction *)local_90);
  if (bVar1) {
    __end2 = std::
             unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
             ::begin((unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
                      *)local_90);
    image = (pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*> *)
            std::
            unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
            ::end((unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
                   *)local_90);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
                              ,(_Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
                                *)&image), bVar1) {
      descriptor_set_binding =
           std::__detail::
           _Node_iterator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_false,_true>
           ::operator*(&__end2);
      SVar3 = UpdateImageVariableToSampledImage
                        (this,descriptor_set_binding->second,&descriptor_set_binding->first);
      descriptor_set_binding_pair_to_sampler._M_h._M_single_bucket._4_4_ =
           CombineStatus(descriptor_set_binding_pair_to_sampler._M_h._M_single_bucket._4_4_,SVar3);
      this_local._4_4_ = descriptor_set_binding_pair_to_sampler._M_h._M_single_bucket._4_4_;
      if (descriptor_set_binding_pair_to_sampler._M_h._M_single_bucket._4_4_ == Failure)
      goto LAB_00901050;
      std::__detail::
      _Node_iterator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_false,_true>
      ::operator++(&__end2);
    }
    this_00 = &descriptor_set_binding_pair_to_image._M_h._M_single_bucket;
    __end2_1 = std::
               unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
               ::begin((unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
                        *)this_00);
    sampler = (pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*> *)
              std::
              unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
              ::end((unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
                     *)this_00);
    while (bVar1 = std::__detail::operator!=
                             (&__end2_1.
                               super__Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
                              ,(_Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
                                *)&sampler), bVar1) {
      image_itr.
      super__Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
                 )std::__detail::
                  _Node_iterator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_false,_true>
                  ::operator*(&__end2_1);
      local_e0._M_cur =
           (__node_type *)
           std::
           unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
           ::find((unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
                   *)local_90,
                  (key_type *)
                  image_itr.
                  super__Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
                  ._M_cur);
      local_e8._M_cur =
           (__node_type *)
           std::
           unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
           ::end((unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
                  *)local_90);
      bVar2 = std::__detail::operator==(&local_e0,&local_e8);
      bVar1 = true;
      if (!bVar2) {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_false,_true>
                               *)&local_e0);
        bVar1 = ppVar4->second == (Instruction *)0x0;
      }
      if (bVar1) {
        this_local._4_4_ = Failure;
        goto LAB_00901050;
      }
      sampler_variable =
           *(Instruction **)
            ((long)image_itr.
                   super__Node_iterator_base<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_true>
                   ._M_cur + 8);
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_false,_true>
                             *)&local_e0);
      SVar3 = CheckUsesOfSamplerVariable(this,sampler_variable,ppVar4->second);
      descriptor_set_binding_pair_to_sampler._M_h._M_single_bucket._4_4_ =
           CombineStatus(descriptor_set_binding_pair_to_sampler._M_h._M_single_bucket._4_4_,SVar3);
      this_local._4_4_ = descriptor_set_binding_pair_to_sampler._M_h._M_single_bucket._4_4_;
      if (descriptor_set_binding_pair_to_sampler._M_h._M_single_bucket._4_4_ == Failure)
      goto LAB_00901050;
      std::__detail::
      _Node_iterator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>,_false,_true>
      ::operator++(&__end2_1);
    }
    this_local._4_4_ = descriptor_set_binding_pair_to_sampler._M_h._M_single_bucket._4_4_;
  }
  else {
    this_local._4_4_ = Failure;
  }
LAB_00901050:
  std::
  unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
  ::~unordered_map((unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
                    *)local_90);
  std::
  unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
  ::~unordered_map((unordered_map<spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*,_spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,_std::equal_to<spvtools::opt::DescriptorSetAndBinding>,_std::allocator<std::pair<const_spvtools::opt::DescriptorSetAndBinding,_spvtools::opt::Instruction_*>_>_>
                    *)&descriptor_set_binding_pair_to_image._M_h._M_single_bucket);
  return this_local._4_4_;
}

Assistant:

Pass::Status ConvertToSampledImagePass::Process() {
  Status status = Status::SuccessWithoutChange;

  DescriptorSetBindingToInstruction descriptor_set_binding_pair_to_sampler,
      descriptor_set_binding_pair_to_image;
  if (!CollectResourcesToConvert(&descriptor_set_binding_pair_to_sampler,
                                 &descriptor_set_binding_pair_to_image)) {
    return Status::Failure;
  }

  for (auto& image : descriptor_set_binding_pair_to_image) {
    status = CombineStatus(
        status, UpdateImageVariableToSampledImage(image.second, image.first));
    if (status == Status::Failure) {
      return status;
    }
  }

  for (const auto& sampler : descriptor_set_binding_pair_to_sampler) {
    // Converting only a Sampler to Sampled Image is not allowed. It must have a
    // corresponding image to combine the sampler with.
    auto image_itr = descriptor_set_binding_pair_to_image.find(sampler.first);
    if (image_itr == descriptor_set_binding_pair_to_image.end() ||
        image_itr->second == nullptr) {
      return Status::Failure;
    }

    status = CombineStatus(
        status, CheckUsesOfSamplerVariable(sampler.second, image_itr->second));
    if (status == Status::Failure) {
      return status;
    }
  }

  return status;
}